

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct.c
# Opt level: O2

IceTImage icetDirectCompose(void)

{
  bool bVar1;
  IceTSizeType num_bytes;
  IceTImage image;
  IceTVoid *inSparseImageBuffer;
  IceTSparseImage outSparseImage;
  IceTInt *pIVar2;
  IceTInt *pIVar3;
  long lVar4;
  IceTInt display_tile;
  IceTInt num_tiles;
  IceTInt max_height;
  IceTInt max_width;
  
  icetGetIntegerv(0x13,&max_width);
  icetGetIntegerv(0x14,&max_height);
  icetGetIntegerv(0x10,&num_tiles);
  num_bytes = icetSparseImageBufferSize(max_width,max_height);
  image = icetGetStateBufferImage(0x1a0,max_width,max_height);
  inSparseImageBuffer = icetGetStateBuffer(0x1a1,num_bytes);
  outSparseImage = icetGetStateBufferSparseImage(0x1a2,max_width,max_height);
  pIVar2 = (IceTInt *)icetGetStateBuffer(0x1a3,num_tiles << 2);
  icetGetIntegerv(0x1b,&display_tile);
  if (display_tile < 0) {
    bVar1 = true;
  }
  else {
    pIVar3 = icetUnsafeStateGetInteger(0x8a);
    bVar1 = pIVar3[display_tile] < 1;
  }
  pIVar3 = icetUnsafeStateGetInteger(0x1a);
  for (lVar4 = 0; lVar4 < num_tiles; lVar4 = lVar4 + 1) {
    pIVar2[lVar4] = pIVar3[lVar4];
  }
  icetRenderTransferFullImages(image,inSparseImageBuffer,outSparseImage,pIVar2);
  if ((bool)(-1 < display_tile & bVar1)) {
    pIVar2 = icetUnsafeStateGetInteger(0x11);
    icetImageSetDimensions
              (image,pIVar2[(long)display_tile * 4 + 2],pIVar2[(long)display_tile * 4 + 3]);
    icetClearImage(image);
  }
  return (IceTImage)image.opaque_internals;
}

Assistant:

IceTImage icetDirectCompose(void)
{
    IceTImage image;
    IceTVoid *inSparseImageBuffer;
    IceTSparseImage outSparseImage;
    IceTSizeType sparseImageSize;
    const IceTInt *contrib_counts;
    const IceTInt *display_nodes;
    IceTInt max_width, max_height;
    IceTInt num_tiles;
    IceTInt num_contributors;
    IceTInt display_tile;
    IceTInt tile;
    IceTInt *tile_image_dest;
    icetRaiseDebug("In Direct Compose");

    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);

    sparseImageSize = icetSparseImageBufferSize(max_width, max_height);

    image               = icetGetStateBufferImage(DIRECT_IMAGE_BUFFER,
                                                  max_width, max_height);
    inSparseImageBuffer = icetGetStateBuffer(DIRECT_IN_SPARSE_IMAGE_BUFFER,
                                             sparseImageSize);
    outSparseImage      = icetGetStateBufferSparseImage(
                                                 DIRECT_OUT_SPARSE_IMAGE_BUFFER,
                                                 max_width, max_height);
    tile_image_dest     = icetGetStateBuffer(DIRECT_TILE_IMAGE_DEST_BUFFER,
                                             num_tiles*sizeof(IceTInt));

    icetGetIntegerv(ICET_TILE_DISPLAYED, &display_tile);
    if (display_tile >= 0) {
        contrib_counts = icetUnsafeStateGetInteger(ICET_TILE_CONTRIB_COUNTS);
        num_contributors = contrib_counts[display_tile];
    } else {
        num_contributors = 0;
    }

    display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    for (tile = 0; tile < num_tiles; tile++) {
        tile_image_dest[tile] = display_nodes[tile];
    }

    icetRaiseDebug("Rendering and transferring images.");
    icetRenderTransferFullImages(image,
                                 inSparseImageBuffer,
                                 outSparseImage,
                                 tile_image_dest);

    if ((display_tile >= 0) && (num_contributors < 1)) {
      /* Must be displaying a blank tile. */
        const IceTInt *tile_viewports
            = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
        const IceTInt *display_tile_viewport = tile_viewports + 4*display_tile;
        IceTInt display_tile_width = display_tile_viewport[2];
        IceTInt display_tile_height = display_tile_viewport[3];

        icetRaiseDebug("Returning blank tile.");
        icetImageSetDimensions(image, display_tile_width, display_tile_height);
        icetClearImage(image);
    }

    return image;
}